

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void op_addr_block_post(DisasContext_conflict1 *s,arg_ldst_block *a,TCGv_i32 addr,int n)

{
  TCGContext_conflict1 *s_00;
  int arg2;
  uintptr_t o;
  
  s_00 = s->uc->tcg_ctx;
  if (a->w == 0) {
    tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(addr + (long)s_00));
    return;
  }
  if (a->b == 0) {
    arg2 = 4;
    if (a->i == 0) {
      arg2 = n * -4;
    }
  }
  else {
    if (n == 1 || a->i != 0) goto LAB_0065dc70;
    arg2 = n * -4 + 4;
  }
  tcg_gen_addi_i32_aarch64(s_00,addr,addr,arg2);
LAB_0065dc70:
  store_reg(s,a->rn,addr);
  return;
}

Assistant:

static void op_addr_block_post(DisasContext *s, arg_ldst_block *a,
                               TCGv_i32 addr, int n)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (a->w) {
        /* write back */
        if (!a->b) {
            if (a->i) {
                /* post increment */
                tcg_gen_addi_i32(tcg_ctx, addr, addr, 4);
            } else {
                /* post decrement */
                tcg_gen_addi_i32(tcg_ctx, addr, addr, -(n * 4));
            }
        } else if (!a->i && n != 1) {
            /* pre decrement */
            tcg_gen_addi_i32(tcg_ctx, addr, addr, -((n - 1) * 4));
        }
        store_reg(s, a->rn, addr);
    } else {
        tcg_temp_free_i32(tcg_ctx, addr);
    }
}